

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfoEx
               (SnapScriptFunctionInfo *snapFuncInfo,FileReader *reader,SlabAllocator *alloc)

{
  TTD_PTR_ID TVar1;
  TTDVar pvVar2;
  FileReader *reader_00;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapScriptFunctionInfo *snapFuncInfo_local;
  
  TVar1 = FileReader::ReadAddr(reader,functionBodyId,true);
  snapFuncInfo->BodyRefId = TVar1;
  FileReader::ReadString<TTD::SlabAllocatorBase<0>>
            (reader,name,alloc,&snapFuncInfo->DebugFunctionName,true);
  TVar1 = FileReader::ReadAddr(reader,cachedScopeObjId,true);
  snapFuncInfo->CachedScopeObjId = TVar1;
  TVar1 = FileReader::ReadAddr(reader,scopeId,true);
  snapFuncInfo->ScopeId = TVar1;
  TVar1 = FileReader::ReadAddr(reader,ptrIdVal,true);
  snapFuncInfo->HomeObjId = TVar1;
  (*reader->_vptr_FileReader[3])(reader,0x38,1);
  pvVar2 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  snapFuncInfo->ComputedNameInfo = pvVar2;
  return;
}

Assistant:

void ParseAddtlInfo_SnapScriptFunctionInfoEx(SnapScriptFunctionInfo* snapFuncInfo, FileReader* reader, SlabAllocator& alloc)
        {
            snapFuncInfo->BodyRefId = reader->ReadAddr(NSTokens::Key::functionBodyId, true);
            reader->ReadString(NSTokens::Key::name, alloc, snapFuncInfo->DebugFunctionName, true);
            snapFuncInfo->CachedScopeObjId = reader->ReadAddr(NSTokens::Key::cachedScopeObjId, true);
            snapFuncInfo->ScopeId = reader->ReadAddr(NSTokens::Key::scopeId, true);
            snapFuncInfo->HomeObjId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);

            reader->ReadKey(NSTokens::Key::nameInfo, true);
            snapFuncInfo->ComputedNameInfo = NSSnapValues::ParseTTDVar(false, reader);
        }